

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_finalize(sqlite3_stmt *pStmt)

{
  sqlite3 *db;
  uint uVar1;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    uVar1 = 0;
  }
  else {
    db = *(sqlite3 **)pStmt;
    if (db == (sqlite3 *)0x0) {
      uVar1 = 0x15;
      sqlite3_log(0x15,"API called with finalized prepared statement");
      sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x12c1e,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (0 < *(long *)(pStmt + 0xb0)) {
        invokeProfileCallback(db,(Vdbe *)pStmt);
      }
      uVar1 = sqlite3VdbeFinalize((Vdbe *)pStmt);
      if ((uVar1 == 0xc0a) || (db->mallocFailed != '\0')) {
        apiOomError(db);
        uVar1 = 7;
      }
      else {
        uVar1 = uVar1 & db->errMask;
      }
      sqlite3LeaveMutexAndCloseZombie(db);
    }
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_finalize(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    /* IMPLEMENTATION-OF: R-57228-12904 Invoking sqlite3_finalize() on a NULL
    ** pointer is a harmless no-op. */
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    if( vdbeSafety(v) ) return SQLITE_MISUSE_BKPT;
    sqlite3_mutex_enter(db->mutex);
    checkProfileCallback(db, v);
    rc = sqlite3VdbeFinalize(v);
    rc = sqlite3ApiExit(db, rc);
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return rc;
}